

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.cpp
# Opt level: O2

void __thiscall argo::json::move_json(json *this,json *other)

{
  type tVar1;
  
  if (this != other) {
    reset(this);
    tVar1 = other->m_type;
    this->m_type = tVar1;
    switch(tVar1) {
    case object_e:
      move_construct_object(this,&(other->m_value).u_object);
      break;
    case array_e:
      move_construct_array(this,&(other->m_value).u_array);
      break;
    case boolean_e:
      (this->m_value).u_boolean = (other->m_value).u_boolean;
      break;
    case number_int_e:
      (this->m_value).u_number_int = (other->m_value).u_number_int;
      break;
    case number_double_e:
      (this->m_value).u_array.
      super__Vector_base<std::unique_ptr<argo::json,_std::default_delete<argo::json>_>,_std::allocator<std::unique_ptr<argo::json,_std::default_delete<argo::json>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start =
           (other->m_value).u_array.
           super__Vector_base<std::unique_ptr<argo::json,_std::default_delete<argo::json>_>,_std::allocator<std::unique_ptr<argo::json,_std::default_delete<argo::json>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
      break;
    case string_e:
      std::__cxx11::string::string
                ((string *)&(this->m_value).u_object,(string *)&(other->m_value).u_object);
    }
    std::__cxx11::string::operator=((string *)&this->m_raw_value,(string *)&other->m_raw_value);
    other->m_type = null_e;
  }
  return;
}

Assistant:

void json::move_json(json &other)
{
    if (this == &other) return;

    reset();
    m_type = other.m_type;
    if (m_type == object_e)
    {
        move_construct_object(std::move(other.m_value.u_object));
    }
    else if (m_type == array_e)
    {
        move_construct_array(std::move(other.m_value.u_array));
    }
    else if (m_type == string_e)
    {
        construct_string(other.m_value.u_string);
    }
    else if (m_type == boolean_e)
    {
        m_value.u_boolean = other.m_value.u_boolean;
    }
    else if (m_type == number_int_e)
    {
        m_value.u_number_int = other.m_value.u_number_int;
    }
    else if (m_type == number_double_e)
    {
        m_value.u_number_double = other.m_value.u_number_double;
    }

    m_raw_value = std::move(other.m_raw_value);

    other.m_type = null_e;
}